

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunkref.c
# Opt level: O0

void * nn_chunkref_getchunk(nn_chunkref *self)

{
  FILE *__stream;
  int *piVar1;
  char *pcVar2;
  uint *puVar3;
  nn_chunkref *local_30;
  void *chunk;
  nn_chunkref_chunk *ch;
  nn_chunkref *pnStack_18;
  int rc;
  nn_chunkref *self_local;
  
  if ((self->u).ref[0] == 0xff) {
    (self->u).ref[0] = '\0';
    self_local = *(nn_chunkref **)((long)&self->u + 8);
  }
  else {
    pnStack_18 = self;
    ch._4_4_ = nn_chunk_alloc((ulong)(self->u).ref[0],0,&local_30);
    __stream = _stderr;
    if (ch._4_4_ != 0) {
      piVar1 = __errno_location();
      pcVar2 = nn_err_strerror(*piVar1);
      puVar3 = (uint *)__errno_location();
      fprintf(__stream,"%s [%d] (%s:%d)\n",pcVar2,(ulong)*puVar3,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/utils/chunkref.c"
              ,0x5a);
      fflush(_stderr);
      nn_err_abort();
    }
    memcpy(local_30,(void *)((long)&pnStack_18->u + 1),(ulong)(pnStack_18->u).ref[0]);
    (pnStack_18->u).ref[0] = '\0';
    self_local = local_30;
  }
  return self_local;
}

Assistant:

void *nn_chunkref_getchunk (struct nn_chunkref *self)
{
    int rc;
    struct nn_chunkref_chunk *ch;
    void *chunk;

    if (self->u.ref [0] == 0xff) {
        ch = (struct nn_chunkref_chunk*) self;
        self->u.ref [0] = 0;
        return ch->chunk;
    }

    rc = nn_chunk_alloc (self->u.ref [0], 0, &chunk);
    errno_assert (rc == 0);
    memcpy (chunk, &self->u.ref [1], self->u.ref [0]);
    self->u.ref [0] = 0;
    return chunk;
}